

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  iterator __first;
  iterator __last;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  ostream *poVar7;
  pointer ppVar8;
  cmCTestBuildAndTestHandler *this_00;
  void *pvVar9;
  cmCTestGenericHandler *pcVar10;
  bool collapse;
  string local_11e0 [32];
  ostringstream local_11c0 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1048 [32];
  undefined1 local_1028 [8];
  ostringstream cmCTestLog_msg_8;
  undefined1 local_eb0 [8];
  string cwd;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  local_e80;
  iterator it_2;
  ostringstream local_e58 [8];
  ostringstream cmCTestLog_msg_7;
  _Self local_ce0;
  _Base_ptr local_cd8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  local_cd0;
  iterator it_1;
  ostringstream local_ca8 [8];
  ostringstream cmCTestLog_msg_6;
  int local_b2c;
  string local_b28 [4];
  int res;
  ostringstream local_b08 [8];
  ostringstream cmCTestLog_msg_5;
  int retv;
  cmCTestBuildAndTestHandler *handler;
  int plevel;
  char *parallel;
  undefined1 local_950 [8];
  ostringstream cmCTestLog_msg_4;
  _Self local_7d8;
  _Base_ptr local_7d0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  local_7c8;
  iterator it;
  undefined1 local_7a0 [8];
  ostringstream cmCTestLog_msg_3;
  string local_628 [32];
  undefined1 local_608 [8];
  ostringstream cmCTestLog_msg_2;
  string local_490;
  string local_470;
  string local_450;
  reference local_430;
  string *str;
  undefined1 local_408 [8];
  ostringstream cmCTestLog_msg_1;
  string local_290 [32];
  undefined1 local_270 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_f8 [8];
  string input;
  string targ;
  string arg;
  undefined1 local_88 [8];
  string errormsg;
  size_t i;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator local_40;
  bool local_33;
  byte local_32;
  byte local_31;
  bool SRArgumentSpecified;
  bool executeTests;
  char *pcStack_30;
  bool cmakeAndTest;
  char *ctestExec;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTest *this_local;
  
  pcStack_30 = "ctest";
  local_31 = 0;
  local_32 = 1;
  local_33 = false;
  ctestExec = (char *)output;
  output_local = (string *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->InitialCommandLineArguments);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_40,&local_48);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)output_local);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)output_local);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->InitialCommandLineArguments,local_40,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  errormsg.field_2._8_8_ = 1;
  do {
    uVar1 = errormsg.field_2._8_8_;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)output_local);
    if (sVar4 <= (ulong)uVar1) {
      if (((this->ParallelLevelSetInCli & 1U) == 0) &&
         (pcVar5 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL"), pcVar5 != (char *)0x0)) {
        iVar3 = atoi(pcVar5);
        SetParallelLevel(this,iVar3);
      }
      if ((local_31 & 1) == 0) {
        if ((local_32 & 1) == 0) {
          this_local._4_4_ = 1;
          iVar3 = this_local._4_4_;
        }
        else {
          if ((this->RunConfigurationScript & 1U) == 0) {
            this->ExtraVerbose = (bool)(this->Verbose & 1);
            this->Verbose = true;
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
            ::_Rb_tree_iterator(&local_e80);
            local_e80._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                 ::begin(&this->TestingHandlers);
            while( true ) {
              cwd.field_2._8_8_ =
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                   ::end(&this->TestingHandlers);
              bVar2 = std::operator!=(&local_e80,(_Self *)((long)&cwd.field_2 + 8));
              if (!bVar2) break;
              ppVar8 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
                       ::operator->(&local_e80);
              cmCTestGenericHandler::SetVerbose(ppVar8->second,(bool)(this->Verbose & 1));
              ppVar8 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
                       ::operator->(&local_e80);
              cmCTestGenericHandler::SetSubmitIndex(ppVar8->second,this->SubmitIndex);
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
              ::operator++(&local_e80);
            }
            cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                      ((string *)local_eb0,(SystemTools *)0x1,collapse);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            iVar3 = Initialize(this,pcVar5,(cmCTestStartCommand *)0x0);
            if (iVar3 == 0) {
              local_b2c = 0xc;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1028);
              poVar7 = std::operator<<((ostream *)local_1028,"Problem initializing the dashboard.");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                  ,0xa30,pcVar5,false);
              std::__cxx11::string::~string(local_1048);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1028);
            }
            else {
              local_b2c = ProcessTests(this);
            }
            Finalize(this);
            std::__cxx11::string::~string((string *)local_eb0);
          }
          else {
            if ((this->ExtraVerbose & 1U) != 0) {
              std::__cxx11::ostringstream::ostringstream(local_ca8);
              poVar7 = std::operator<<((ostream *)local_ca8,"* Extra verbosity turned on");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              Log(this,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                  ,0xa0a,pcVar5,false);
              std::__cxx11::string::~string((string *)&it_1);
              std::__cxx11::ostringstream::~ostringstream(local_ca8);
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
            ::_Rb_tree_iterator(&local_cd0);
            local_cd8 = (_Base_ptr)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                        ::begin(&this->TestingHandlers);
            local_cd0._M_node = local_cd8;
            while( true ) {
              local_ce0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                   ::end(&this->TestingHandlers);
              bVar2 = std::operator!=(&local_cd0,&local_ce0);
              if (!bVar2) break;
              ppVar8 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
                       ::operator->(&local_cd0);
              cmCTestGenericHandler::SetVerbose(ppVar8->second,(bool)(this->ExtraVerbose & 1));
              ppVar8 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
                       ::operator->(&local_cd0);
              cmCTestGenericHandler::SetSubmitIndex(ppVar8->second,this->SubmitIndex);
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
              ::operator++(&local_cd0);
            }
            pcVar10 = GetHandler(this,"script");
            cmCTestGenericHandler::SetVerbose(pcVar10,(bool)(this->Verbose & 1));
            pcVar10 = GetHandler(this,"script");
            local_b2c = (*(pcVar10->super_cmObject)._vptr_cmObject[5])();
            if (local_b2c != 0) {
              std::__cxx11::ostringstream::ostringstream(local_e58);
              poVar7 = std::operator<<((ostream *)local_e58,"running script failing returning: ");
              pvVar9 = (void *)std::ostream::operator<<(poVar7,local_b2c);
              std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              Log(this,0,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                  ,0xa19,pcVar5,false);
              std::__cxx11::string::~string((string *)&it_2);
              std::__cxx11::ostringstream::~ostringstream(local_e58);
            }
          }
          if (local_b2c != 0) {
            std::__cxx11::ostringstream::ostringstream(local_11c0);
            poVar7 = std::operator<<((ostream *)local_11c0,"Running a test(s) failed returning : ");
            pvVar9 = (void *)std::ostream::operator<<(poVar7,local_b2c);
            std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Log(this,0,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                ,0xa3b,pcVar5,false);
            std::__cxx11::string::~string(local_11e0);
            std::__cxx11::ostringstream::~ostringstream(local_11c0);
          }
          this_local._4_4_ = local_b2c;
          iVar3 = this_local._4_4_;
        }
      }
      else {
        this->Verbose = true;
        this_00 = (cmCTestBuildAndTestHandler *)GetHandler(this,"buildtest");
        iVar3 = (*(this_00->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject[5])();
        pcVar5 = cmCTestBuildAndTestHandler::GetOutput(this_00);
        std::__cxx11::string::operator=((string *)ctestExec,pcVar5);
        cmDynamicLoader::FlushCache();
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream(local_b08);
          poVar7 = std::operator<<((ostream *)local_b08,"build and test failing returning: ");
          pvVar9 = (void *)std::ostream::operator<<(poVar7,iVar3);
          std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          Log(this,0,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
              ,0x9fd,pcVar5,false);
          std::__cxx11::string::~string(local_b28);
          std::__cxx11::ostringstream::~ostringstream(local_b08);
        }
      }
      this_local._4_4_ = iVar3;
      return this_local._4_4_;
    }
    std::__cxx11::string::string((string *)local_88);
    bVar2 = HandleCommandLineArguments
                      (this,(size_t *)(errormsg.field_2._M_local_buf + 8),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)output_local,(string *)local_88);
    if (bVar2) {
      HandleScriptArguments
                (this,(size_t *)(errormsg.field_2._M_local_buf + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)output_local,&local_33);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)output_local,errormsg.field_2._8_8_);
      std::__cxx11::string::string((string *)(targ.field_2._M_local_buf + 8),(string *)pvVar6);
      bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"-D","--dashboard");
      uVar1 = errormsg.field_2._8_8_;
      if ((bVar2) &&
         (sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local), (ulong)uVar1 < sVar4 - 1)) {
        this->ProduceXML = true;
        errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)output_local,errormsg.field_2._8_8_);
        std::__cxx11::string::string((string *)(input.field_2._M_local_buf + 8),(string *)pvVar6);
        bVar2 = AddTestsForDashboardType(this,(string *)((long)&input.field_2 + 8));
        if ((!bVar2) &&
           (bVar2 = AddVariableDefinition(this,(string *)((long)&input.field_2 + 8)), !bVar2)) {
          ErrorMessageUnknownDashDValue(this,(string *)((long)&input.field_2 + 8));
          local_32 = 0;
        }
        std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
      }
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&targ.field_2 + 8),"-D");
      if (bVar2) {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::StringStartsWith(pcVar5,"-D");
        if (bVar2) {
          std::__cxx11::string::substr((ulong)local_f8,(ulong)((long)&targ.field_2 + 8));
          AddVariableDefinition(this,(string *)local_f8);
          std::__cxx11::string::~string((string *)local_f8);
        }
      }
      bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"-T","--test-action");
      uVar1 = errormsg.field_2._8_8_;
      if ((bVar2) &&
         (sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local), (ulong)uVar1 < sVar4 - 1)) {
        this->ProduceXML = true;
        errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)output_local,errormsg.field_2._8_8_);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        bVar2 = SetTest(this,pcVar5,false);
        if (!bVar2) {
          local_32 = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
          poVar7 = std::operator<<((ostream *)local_270,"CTest -T called with incorrect option: ");
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)output_local,errormsg.field_2._8_8_);
          poVar7 = std::operator<<(poVar7,(string *)pvVar6);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
              ,0x990,pcVar5,false);
          std::__cxx11::string::~string(local_290);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
          poVar7 = std::operator<<((ostream *)local_408,"Available options are:");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T all");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T start");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T update");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T configure");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T build");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T test");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T coverage");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T memcheck");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T notes");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,pcStack_30);
          poVar7 = std::operator<<(poVar7," -T submit");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
              ,0x99b,pcVar5,false);
          std::__cxx11::string::~string((string *)&str);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
        }
      }
      bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"-M","--test-model");
      uVar1 = errormsg.field_2._8_8_;
      if ((bVar2) &&
         (sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local), (ulong)uVar1 < sVar4 - 1)) {
        errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
        local_430 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)output_local,errormsg.field_2._8_8_);
        cmsys::SystemTools::LowerCase(&local_450,local_430);
        bVar2 = std::operator==(&local_450,"nightly");
        std::__cxx11::string::~string((string *)&local_450);
        if (bVar2) {
          SetTestModel(this,1);
        }
        else {
          cmsys::SystemTools::LowerCase(&local_470,local_430);
          bVar2 = std::operator==(&local_470,"continuous");
          std::__cxx11::string::~string((string *)&local_470);
          if (bVar2) {
            SetTestModel(this,2);
          }
          else {
            cmsys::SystemTools::LowerCase(&local_490,local_430);
            bVar2 = std::operator==(&local_490,"experimental");
            std::__cxx11::string::~string((string *)&local_490);
            if (bVar2) {
              SetTestModel(this,0);
            }
            else {
              local_32 = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
              poVar7 = std::operator<<((ostream *)local_608,
                                       "CTest -M called with incorrect option: ");
              poVar7 = std::operator<<(poVar7,(string *)local_430);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                  ,0x9b6,pcVar5,false);
              std::__cxx11::string::~string(local_628);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7a0);
              poVar7 = std::operator<<((ostream *)local_7a0,"Available options are:");
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              poVar7 = std::operator<<(poVar7,"  ");
              poVar7 = std::operator<<(poVar7,pcStack_30);
              poVar7 = std::operator<<(poVar7," -M Continuous");
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              poVar7 = std::operator<<(poVar7,"  ");
              poVar7 = std::operator<<(poVar7,pcStack_30);
              poVar7 = std::operator<<(poVar7," -M Experimental");
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              poVar7 = std::operator<<(poVar7,"  ");
              poVar7 = std::operator<<(poVar7,pcStack_30);
              poVar7 = std::operator<<(poVar7," -M Nightly");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                  ,0x9ba,pcVar5,false);
              std::__cxx11::string::~string((string *)&it);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7a0);
            }
          }
        }
      }
      bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--extra-submit",(char *)0x0);
      uVar1 = errormsg.field_2._8_8_;
      if ((bVar2) &&
         (sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local), (ulong)uVar1 < sVar4 - 1)) {
        this->ProduceXML = true;
        SetTest(this,"Submit",true);
        errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)output_local,errormsg.field_2._8_8_);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        bVar2 = SubmitExtraFiles(this,pcVar5);
        if (bVar2) goto LAB_004c43a6;
        this_local._4_4_ = 0;
        bVar2 = true;
      }
      else {
LAB_004c43a6:
        bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--build-and-test",
                              (char *)0x0);
        uVar1 = errormsg.field_2._8_8_;
        if ((bVar2) &&
           (sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)output_local), (ulong)uVar1 < sVar4 - 1)) {
          local_31 = 1;
        }
        bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--schedule-random",
                              (char *)0x0);
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&this->ScheduleType,"Random");
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
        ::_Rb_tree_iterator(&local_7c8);
        local_7d0 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                    ::begin(&this->TestingHandlers);
        local_7c8._M_node = local_7d0;
        while( true ) {
          local_7d8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
               ::end(&this->TestingHandlers);
          bVar2 = std::operator!=(&local_7c8,&local_7d8);
          if (!bVar2) break;
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
                   ::operator->(&local_7c8);
          iVar3 = (*(ppVar8->second->super_cmObject)._vptr_cmObject[6])
                            (ppVar8->second,(undefined1 *)((long)&targ.field_2 + 8),
                             (undefined1 *)((long)&errormsg.field_2 + 8),output_local);
          if (iVar3 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_950);
            std::operator<<((ostream *)local_950,
                            "Problem parsing command line arguments within a handler");
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Log(this,6,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                ,0x9df,pcVar5,false);
            std::__cxx11::string::~string((string *)&parallel);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_950);
            this_local._4_4_ = 0;
            bVar2 = true;
            goto LAB_004c45e8;
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
          ::operator++(&local_7c8);
        }
        bVar2 = false;
      }
LAB_004c45e8:
      std::__cxx11::string::~string((string *)(targ.field_2._M_local_buf + 8));
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar5,(char *)0x0,(char *)0x0,(char *)0x0);
      this_local._4_4_ = 1;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_88);
    if (bVar2) {
      return this_local._4_4_;
    }
    errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

int cmCTest::Run(std::vector<std::string> &args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  this->InitialCommandLineArguments.insert(
      this->InitialCommandLineArguments.end(),
      args.begin(), args.end());

  // process the command line arguments
  for(size_t i=1; i < args.size(); ++i)
    {
    // handle the simple commandline arguments
    std::string errormsg;
    if(!this->HandleCommandLineArguments(i,args, errormsg))
      {
      cmSystemTools::Error(errormsg.c_str());
      return 1;
      }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i,args,SRArgumentSpecified);

    // handle a request for a dashboard
    std::string arg = args[i];
    if(this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1 )
      {
      this->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ))
        {
        if (!this->AddVariableDefinition(targ))
          {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
          }
        }
      }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if(arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D"))
      {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
      }

    if(this->CheckArgument(arg, "-T", "--test-action") &&
      (i < args.size() -1) )
      {
      this->ProduceXML = true;
      i++;
      if ( !this->SetTest(args[i].c_str(), false) )
        {
        executeTests = false;
        cmCTestLog(this, ERROR_MESSAGE,
          "CTest -T called with incorrect option: "
          << args[i] << std::endl);
        cmCTestLog(this, ERROR_MESSAGE, "Available options are:" << std::endl
          << "  " << ctestExec << " -T all" << std::endl
          << "  " << ctestExec << " -T start" << std::endl
          << "  " << ctestExec << " -T update" << std::endl
          << "  " << ctestExec << " -T configure" << std::endl
          << "  " << ctestExec << " -T build" << std::endl
          << "  " << ctestExec << " -T test" << std::endl
          << "  " << ctestExec << " -T coverage" << std::endl
          << "  " << ctestExec << " -T memcheck" << std::endl
          << "  " << ctestExec << " -T notes" << std::endl
          << "  " << ctestExec << " -T submit" << std::endl);
        }
      }

    // what type of test model
    if(this->CheckArgument(arg, "-M", "--test-model") &&
      (i < args.size() -1) )
      {
      i++;
      std::string const& str = args[i];
      if ( cmSystemTools::LowerCase(str) == "nightly" )
        {
        this->SetTestModel(cmCTest::NIGHTLY);
        }
      else if ( cmSystemTools::LowerCase(str) == "continuous" )
        {
        this->SetTestModel(cmCTest::CONTINUOUS);
        }
      else if ( cmSystemTools::LowerCase(str) == "experimental" )
        {
        this->SetTestModel(cmCTest::EXPERIMENTAL);
        }
      else
        {
        executeTests = false;
        cmCTestLog(this, ERROR_MESSAGE,
          "CTest -M called with incorrect option: " << str
          << std::endl);
        cmCTestLog(this, ERROR_MESSAGE, "Available options are:" << std::endl
          << "  " << ctestExec << " -M Continuous" << std::endl
          << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
        }
      }

    if(this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1)
      {
      this->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if ( !this->SubmitExtraFiles(args[i].c_str()) )
        {
        return 0;
        }
      }

    // --build-and-test options
    if(this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1)
      {
      cmakeAndTest = true;
      }

    if(this->CheckArgument(arg, "--schedule-random"))
      {
      this->ScheduleType = "Random";
      }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    cmCTest::t_TestingHandlers::iterator it;
    for ( it = this->TestingHandlers.begin();
      it != this->TestingHandlers.end();
      ++ it )
      {
      if ( !it->second->ProcessCommandLineArguments(arg, i, args) )
        {
        cmCTestLog(this, ERROR_MESSAGE,
          "Problem parsing command line arguments within a handler");
        return 0;
        }
      }
    } // the close of the for argument loop

  if (!this->ParallelLevelSetInCli)
    {
    if (const char *parallel = cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL"))
      {
      int plevel = atoi(parallel);
      this->SetParallelLevel(plevel);
      }
    }

  // now what sould cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if(cmakeAndTest)
    {
    this->Verbose = true;
    cmCTestBuildAndTestHandler* handler =
      static_cast<cmCTestBuildAndTestHandler*>(this->GetHandler("buildtest"));
    int retv = handler->ProcessHandler();
    *output = handler->GetOutput();
#ifdef CMAKE_BUILD_WITH_CMAKE
    cmDynamicLoader::FlushCache();
#endif
    if(retv != 0)
      {
      cmCTestLog(this, DEBUG, "build and test failing returning: " << retv
                 << std::endl);
      }
    return retv;
    }

  if(executeTests)
    {
    int res;
    // call process directory
    if (this->RunConfigurationScript)
      {
      if ( this->ExtraVerbose )
        {
        cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
        }
      cmCTest::t_TestingHandlers::iterator it;
      for ( it = this->TestingHandlers.begin();
        it != this->TestingHandlers.end();
        ++ it )
        {
        it->second->SetVerbose(this->ExtraVerbose);
        it->second->SetSubmitIndex(this->SubmitIndex);
        }
      this->GetHandler("script")->SetVerbose(this->Verbose);
      res = this->GetHandler("script")->ProcessHandler();
      if(res != 0)
        {
        cmCTestLog(this, DEBUG, "running script failing returning: " << res
                   << std::endl);
        }

      }
    else
      {
      // What is this?  -V seems to be the same as -VV,
      // and Verbose is always on in this case
      this->ExtraVerbose = this->Verbose;
      this->Verbose = true;
      cmCTest::t_TestingHandlers::iterator it;
      for ( it = this->TestingHandlers.begin();
        it != this->TestingHandlers.end();
        ++ it )
        {
        it->second->SetVerbose(this->Verbose);
        it->second->SetSubmitIndex(this->SubmitIndex);
        }
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      if(!this->Initialize(cwd.c_str(), 0))
        {
        res = 12;
        cmCTestLog(this, ERROR_MESSAGE, "Problem initializing the dashboard."
          << std::endl);
        }
      else
        {
        res = this->ProcessTests();
        }
      this->Finalize();
      }
    if(res != 0)
      {
      cmCTestLog(this, DEBUG, "Running a test(s) failed returning : " << res
                 << std::endl);
      }
    return res;
    }

  return 1;
}